

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktx2check.cpp
# Opt level: O3

void __thiscall ktxValidator::validateKvd(ktxValidator *this,validationContext *ctx)

{
  uint *args;
  uint uVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  uint *puVar5;
  int *piVar6;
  char *pcVar7;
  long *plVar8;
  uint uVar9;
  uint *puVar10;
  long lVar11;
  uint uVar12;
  _Alloc_hider _Var13;
  bool bVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  bool bVar18;
  float fVar19;
  char *key;
  ktxHashList kvDataHead;
  uint32_t valueLen;
  uint32_t keyLen;
  char *prevKey;
  uint32_t keyLen_1;
  uint32_t prevKeyLen;
  char *local_280;
  long local_278;
  uint32_t local_26c;
  uint *local_268;
  ulong local_260;
  uint8_t *local_258;
  validationContext *local_250;
  char *local_248;
  undefined1 local_240 [8];
  _Alloc_hider local_238;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  undefined1 local_218 [4];
  undefined1 local_214 [4];
  undefined1 local_210 [8];
  _Alloc_hider local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  undefined1 local_1e8 [8];
  _Alloc_hider local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0;
  undefined1 local_1c0 [8];
  _Alloc_hider local_1b8;
  long local_1a8 [2];
  undefined1 local_198 [8];
  _Alloc_hider local_190;
  long local_180 [2];
  undefined1 local_170 [8];
  _Alloc_hider local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  undefined1 local_148 [8];
  _Alloc_hider local_140;
  long local_130 [2];
  undefined1 local_120 [8];
  _Alloc_hider local_118;
  long local_108 [2];
  undefined1 local_f8 [8];
  _Alloc_hider local_f0;
  long local_e0 [2];
  undefined1 local_d0 [8];
  _Alloc_hider local_c8;
  long local_b8 [2];
  undefined1 local_a8 [8];
  _Alloc_hider local_a0;
  long local_90 [2];
  undefined1 local_80 [8];
  _Alloc_hider local_78;
  long local_68 [2];
  undefined1 local_58 [8];
  _Alloc_hider local_50;
  long local_40 [2];
  
  uVar1 = (ctx->header).keyValueData.byteLength;
  uVar17 = (ulong)uVar1;
  if (uVar17 == 0) {
    return;
  }
  puVar5 = (uint *)operator_new__(uVar17);
  std::istream::read((char *)ctx->inp,(long)puVar5);
  uVar16 = *(uint *)(ctx->inp + *(long *)(*(long *)ctx->inp + -0x18) + 0x20);
  if ((uVar16 & 5) == 0) {
    if ((uVar16 & 2) != 0) {
      local_80._0_4_ = IOError.UnexpectedEOF.code;
      plVar8 = local_68;
      local_78._M_p = (pointer)plVar8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_78,IOError.UnexpectedEOF.message._M_dataplus._M_p,
                 IOError.UnexpectedEOF.message._M_dataplus._M_p +
                 IOError.UnexpectedEOF.message._M_string_length);
      addIssue<>(this,eFatal,(issue *)local_80);
      _Var13._M_p = local_78._M_p;
      goto LAB_0010daa6;
    }
  }
  else {
    local_58._0_4_ = IOError.FileRead.code;
    plVar8 = local_40;
    local_50._M_p = (pointer)plVar8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,IOError.FileRead.message._M_dataplus._M_p,
               IOError.FileRead.message._M_dataplus._M_p + IOError.FileRead.message._M_string_length
              );
    piVar6 = __errno_location();
    pcVar7 = strerror(*piVar6);
    addIssue<char*>(this,eFatal,(issue *)local_58,pcVar7);
    _Var13._M_p = local_50._M_p;
LAB_0010daa6:
    if ((long *)_Var13._M_p != plVar8) {
      operator_delete(_Var13._M_p,*plVar8 + 1);
    }
  }
  bVar14 = true;
  uVar12 = 0;
  uVar16 = 0;
  local_268 = puVar5;
  local_250 = ctx;
  do {
    args = puVar5 + 1;
    if (((uchar)puVar5[1] == 0xef) && (*(uchar *)((long)puVar5 + 5) == 0xbb)) {
      bVar18 = *(uchar *)((long)puVar5 + 6) == 0xbf;
      puVar10 = (uint *)((long)puVar5 + 7);
      if (!bVar18) {
        puVar10 = args;
      }
    }
    else {
      bVar18 = false;
      puVar10 = args;
    }
    uVar15 = (ulong)*puVar5;
    puVar5 = (uint *)((long)puVar5 + uVar15 + 4);
    for (; (puVar10 < puVar5 && ((uchar)*puVar10 != '\0')); puVar10 = (uint *)((long)puVar10 + 1)) {
    }
    if (puVar10 == puVar5) {
      local_240._0_4_ = Metadata.MissingNulTerminator.code;
      local_260 = uVar15;
      local_238._M_p = (pointer)&local_228;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_238,Metadata.MissingNulTerminator.message._M_dataplus._M_p,
                 Metadata.MissingNulTerminator.message._M_dataplus._M_p +
                 Metadata.MissingNulTerminator.message._M_string_length);
      addIssue<unsigned_char*>(this,eError,(issue *)local_240,(uchar *)args);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_p != &local_228) {
        operator_delete(local_238._M_p,local_228._M_allocated_capacity + 1);
      }
      if (bVar18) {
        local_198._0_4_ = Metadata.ForbiddenBOM1.code;
        plVar8 = local_180;
        local_190._M_p = (pointer)plVar8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_190,Metadata.ForbiddenBOM1.message._M_dataplus._M_p,
                   Metadata.ForbiddenBOM1.message._M_dataplus._M_p +
                   Metadata.ForbiddenBOM1.message._M_string_length);
        addIssue<unsigned_char*>(this,eError,(issue *)local_198,(uchar *)args);
        bVar14 = false;
        _Var13._M_p = local_190._M_p;
        uVar15 = local_260;
        if ((long *)local_190._M_p != plVar8) goto LAB_0010dc6c;
      }
      else {
        bVar14 = false;
        uVar15 = local_260;
      }
    }
    else if (bVar18) {
      local_1c0._0_4_ = Metadata.ForbiddenBOM2.code;
      plVar8 = local_1a8;
      local_1b8._M_p = (pointer)plVar8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1b8,Metadata.ForbiddenBOM2.message._M_dataplus._M_p,
                 Metadata.ForbiddenBOM2.message._M_dataplus._M_p +
                 Metadata.ForbiddenBOM2.message._M_string_length);
      addIssue<unsigned_char*>(this,eError,(issue *)local_1c0,(uchar *)args);
      _Var13._M_p = local_1b8._M_p;
      if ((long *)local_1b8._M_p != plVar8) {
LAB_0010dc6c:
        operator_delete(_Var13._M_p,*plVar8 + 1);
      }
    }
    fVar19 = ceilf((float)(uVar15 & 0xffffffff) * 0.25);
    puVar10 = local_268;
    lVar11 = (long)(fVar19 * 4.0);
    uVar3 = (uint)(long)(fVar19 * 4.0 - 9.223372e+18) & (uint)(lVar11 >> 0x3f) | (uint)lVar11;
    uVar12 = uVar12 + 4 + uVar3;
    uVar9 = uVar16 + 1;
  } while ((uVar12 < uVar1) &&
          (puVar5 = (uint *)((long)args + (ulong)uVar3), bVar18 = uVar16 < 0x4a, uVar16 = uVar9,
          bVar18));
  if (uVar9 == 0x4b) {
    local_a8._0_4_ = Metadata.InvalidStructure.code;
    plVar8 = local_90;
    local_a0._M_p = (pointer)plVar8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a0,Metadata.InvalidStructure.message._M_dataplus._M_p,
               Metadata.InvalidStructure.message._M_dataplus._M_p +
               Metadata.InvalidStructure.message._M_string_length);
    addIssue<int>(this,eError,(issue *)local_a8,0x4b);
    _Var13._M_p = local_a0._M_p;
    puVar10 = local_268;
    if ((long *)local_a0._M_p != plVar8) {
LAB_0010ddb6:
      operator_delete(_Var13._M_p,*plVar8 + 1);
    }
  }
  else if (uVar12 != uVar1) {
    local_d0._0_4_ = Metadata.MissingFinalPadding.code;
    plVar8 = local_b8;
    local_c8._M_p = (pointer)plVar8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c8,Metadata.MissingFinalPadding.message._M_dataplus._M_p,
               Metadata.MissingFinalPadding.message._M_dataplus._M_p +
               Metadata.MissingFinalPadding.message._M_string_length);
    addIssue<>(this,eError,(issue *)local_d0);
    _Var13._M_p = local_c8._M_p;
    if ((long *)local_c8._M_p != plVar8) goto LAB_0010ddb6;
  }
  local_278 = 0;
  if (!bVar14) {
    return;
  }
  iVar4 = ktxHashList_Deserialize(&local_278,uVar17,puVar10);
  if (iVar4 == 0) {
    ktxHashListEntry_GetKey(local_278,local_214,&local_248);
    lVar11 = ktxHashList_Next(local_278);
    if (lVar11 != 0) {
      do {
        ktxHashListEntry_GetKey(lVar11,&local_258,&local_280);
        iVar4 = strcmp(local_248,local_280);
        if (0 < iVar4) {
          local_170._0_4_ = Metadata.OutOfOrder.code;
          local_168._M_p = (pointer)&local_158;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_168,Metadata.OutOfOrder.message._M_dataplus._M_p,
                     Metadata.OutOfOrder.message._M_dataplus._M_p +
                     Metadata.OutOfOrder.message._M_string_length);
          addIssue<>(this,eError,(issue *)local_170);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_168._M_p != &local_158) {
            operator_delete(local_168._M_p,local_158._M_allocated_capacity + 1);
          }
          break;
        }
        lVar11 = ktxHashList_Next(lVar11);
      } while (lVar11 != 0);
    }
    if (local_278 != 0) {
      bVar14 = false;
      bVar18 = false;
      lVar11 = local_278;
      do {
        ktxHashListEntry_GetKey(lVar11,local_218,&local_280);
        ktxHashListEntry_GetValue(lVar11,&local_26c,&local_258);
        pcVar7 = local_280;
        iVar4 = strncasecmp(local_280,"KTX",3);
        if (iVar4 == 0) {
          bVar2 = validateMetadata(this,local_250,pcVar7,local_258,local_26c);
          if (!bVar2) {
            local_1e8._0_4_ = Metadata.IllegalMetadata.code;
            local_1e0._M_p = (pointer)&local_1d0;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_1e0,Metadata.IllegalMetadata.message._M_dataplus._M_p,
                       Metadata.IllegalMetadata.message._M_dataplus._M_p +
                       Metadata.IllegalMetadata.message._M_string_length);
            addIssue<char*>(this,eError,(issue *)local_1e8,local_280);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1e0._M_p != &local_1d0) {
              operator_delete(local_1e0._M_p,local_1d0._M_allocated_capacity + 1);
            }
          }
          pcVar7 = local_280;
          iVar4 = strncmp(local_280,"KTXwriter",9);
          bVar18 = (bool)(bVar18 | iVar4 == 0);
          iVar4 = strncmp(pcVar7,"KTXwriterScParams",0x11);
          bVar14 = (bool)(bVar14 | iVar4 == 0);
        }
        else {
          local_210._0_4_ = Metadata.CustomMetadata.code;
          local_208._M_p = (pointer)&local_1f8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_208,Metadata.CustomMetadata.message._M_dataplus._M_p,
                     Metadata.CustomMetadata.message._M_dataplus._M_p +
                     Metadata.CustomMetadata.message._M_string_length);
          addIssue<char*>(this,eWarning,(issue *)local_210,local_280);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_p != &local_1f8) {
            operator_delete(local_208._M_p,local_1f8._M_allocated_capacity + 1);
          }
        }
        lVar11 = ktxHashList_Next(lVar11);
      } while (lVar11 != 0);
      if (bVar18) {
        return;
      }
      if (bVar14) {
        local_120._0_4_ = Metadata.NoRequiredKTXwriter.code;
        plVar8 = local_108;
        local_118._M_p = (pointer)plVar8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_118,Metadata.NoRequiredKTXwriter.message._M_dataplus._M_p,
                   Metadata.NoRequiredKTXwriter.message._M_dataplus._M_p +
                   Metadata.NoRequiredKTXwriter.message._M_string_length);
        addIssue<>(this,eError,(issue *)local_120);
        _Var13._M_p = local_118._M_p;
        goto LAB_0010e17e;
      }
    }
    local_148._0_4_ = Metadata.NoKTXwriter.code;
    plVar8 = local_130;
    local_140._M_p = (pointer)plVar8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_140,Metadata.NoKTXwriter.message._M_dataplus._M_p,
               Metadata.NoKTXwriter.message._M_dataplus._M_p +
               Metadata.NoKTXwriter.message._M_string_length);
    addIssue<>(this,eWarning,(issue *)local_148);
    _Var13._M_p = local_140._M_p;
  }
  else {
    local_f8._0_4_ = System.OutOfMemory.code;
    plVar8 = local_e0;
    local_f0._M_p = (pointer)plVar8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f0,System.OutOfMemory.message._M_dataplus._M_p,
               System.OutOfMemory.message._M_dataplus._M_p +
               System.OutOfMemory.message._M_string_length);
    addIssue<>(this,eError,(issue *)local_f8);
    _Var13._M_p = local_f0._M_p;
  }
LAB_0010e17e:
  if ((long *)_Var13._M_p != plVar8) {
    operator_delete(_Var13._M_p,*plVar8 + 1);
  }
  return;
}

Assistant:

void
ktxValidator::validateKvd(validationContext& ctx)
{
    uint32_t kvdLen = ctx.header.keyValueData.byteLength;
    uint32_t lengthCheck = 0;
    bool allKeysNulTerminated = true;

    if (kvdLen == 0)
        return;

    uint8_t* kvd = new uint8_t[kvdLen];
    ctx.inp->read((char *)kvd, kvdLen);
    if (ctx.inp->fail())
        addIssue(logger::eFatal, IOError.FileRead, strerror(errno));
    else if (ctx.inp->eof())
        addIssue(logger::eFatal, IOError.UnexpectedEOF);

    // Check all kv pairs have valuePadding and it's included in kvdLen;
    uint8_t* pCurKv = kvd;
    uint32_t safetyCount;
    // safetyCount ensures we don't get stuck in an infinite loop in the event
    // the kv data is completely bogus and the "lengths" never add up to kvdLen.
#define MAX_KVPAIRS 75
    for (safetyCount = 0; lengthCheck < kvdLen && safetyCount < MAX_KVPAIRS; safetyCount++) {
        uint32_t curKvLen = *(uint32_t *)pCurKv;
        lengthCheck += sizeof(uint32_t); // Add keyAndValueByteLength to total.
        pCurKv += sizeof(uint32_t); // Move pointer past keyAndValueByteLength.
        uint8_t* p = pCurKv;
        uint8_t* pCurKvEnd = pCurKv + curKvLen;

        // Check for BOM.
        bool bom = false;
        if (*p == 0xEF && *(p+1) == 0xBB && *(p+2) == 0xBF) {
            bom = true;
            p += 3;
        }
        for (; p < pCurKvEnd; p++) {
            if (*p == '\0')
              break;
        }
        bool noNul = (p == pCurKvEnd);
        if (noNul) {
            addIssue(logger::eError, Metadata.MissingNulTerminator, pCurKv);
            allKeysNulTerminated = false;
        }
        if (bom) {
            if (noNul)
                addIssue(logger::eError, Metadata.ForbiddenBOM1, pCurKv);
            else
                addIssue(logger::eError, Metadata.ForbiddenBOM2, pCurKv);
        }
        curKvLen = (uint32_t)padn(4, curKvLen);
        lengthCheck += curKvLen;
        pCurKv += curKvLen;
    }
    if (safetyCount == 75)
        addIssue(logger::eError, Metadata.InvalidStructure, MAX_KVPAIRS);
    else if (lengthCheck != kvdLen)
        addIssue(logger::eError, Metadata.MissingFinalPadding);

    ktxHashList kvDataHead = 0;
    ktxHashListEntry* entry;
    char* prevKey;
    uint32_t prevKeyLen;
    KTX_error_code result;
    bool writerFound = false;
    bool writerScParamsFound = false;

    if (allKeysNulTerminated) {
        result = ktxHashList_Deserialize(&kvDataHead, kvdLen, kvd);
        if (result != KTX_SUCCESS) {
            addIssue(logger::eError, System.OutOfMemory);
            return;
        }

        // Check the entries are sorted
        ktxHashListEntry_GetKey(kvDataHead, &prevKeyLen, &prevKey);
        entry = ktxHashList_Next(kvDataHead);
        for (; entry != NULL; entry = ktxHashList_Next(entry)) {
            uint32_t keyLen;
            char* key;

            ktxHashListEntry_GetKey(entry, &keyLen, &key);
            if (strcmp(prevKey, key) > 0) {
                addIssue(logger::eError, Metadata.OutOfOrder);
                break;
            }
        }

        for (entry = kvDataHead; entry != NULL; entry = ktxHashList_Next(entry)) {
            uint32_t keyLen, valueLen;
            char* key;
            uint8_t* value;

            ktxHashListEntry_GetKey(entry, &keyLen, &key);
            ktxHashListEntry_GetValue(entry, &valueLen, (void**)&value);
            if (strncasecmp(key, "KTX", 3) == 0) {
                if (!validateMetadata(ctx, key, value, valueLen)) {
                    addIssue(logger::eError, Metadata.IllegalMetadata, key);
                }
                if (strncmp(key, "KTXwriter", 9) == 0)
                    writerFound = true;
                if (strncmp(key, "KTXwriterScParams", 17) == 0)
                    writerScParamsFound = true;
            } else {
                addIssue(logger::eWarning, Metadata.CustomMetadata, key);
            }
        }
        if (!writerFound) {
            if (writerScParamsFound)
                addIssue(logger::eError, Metadata.NoRequiredKTXwriter);
            else
                addIssue(logger::eWarning, Metadata.NoKTXwriter);
        }
    }
}